

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O2

double net_bw(char *iface,char *stage)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t __n;
  long lVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  timeval t;
  sensor_slurp proc_net;
  
  if (iface == (char *)0x0) {
    iface = "eth0";
  }
  __s = strdup(iface);
  memcpy(&proc_net,&PTR_anon_var_dwarf_3c82c_00164aa8,0x2008);
  pcVar2 = update_file(&proc_net);
  gettimeofday((timeval *)&t,(__timezone_ptr_t)0x0);
  for (; pcVar2 != (char *)0x0; pcVar2 = skip_whitespace(pcVar2)) {
    __n = strlen(__s);
    iVar1 = strncmp(pcVar2,__s,__n);
    if (iVar1 == 0) break;
    pcVar2 = skip_token(pcVar2);
  }
  pcVar2 = skip_token(pcVar2);
  pcVar2 = skip_whitespace(pcVar2);
  lVar3 = strtol(pcVar2,(char **)0x0,10);
  iVar1 = 8;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    pcVar2 = skip_token(pcVar2);
    pcVar2 = skip_whitespace(pcVar2);
  }
  lVar4 = strtol(pcVar2,(char **)0x0,10);
  free(__s);
  if (((*stage == 's') && (stage[1] == 't')) && (stage[2] == 'a')) {
    printf("Start %ld %ld \n",lVar4,lVar3);
    net_bw::start_time = t.tv_sec * 1000000 + t.tv_usec;
    dVar6 = 0.0;
    net_bw::old_s_bytes = lVar4;
    net_bw::old_r_bytes = lVar3;
  }
  else {
    printf("End %ld %ld \n",lVar4,lVar3);
    dVar6 = ((double)((lVar4 + lVar3) - (net_bw::old_s_bytes + net_bw::old_r_bytes)) /
            (double)((t.tv_sec * 1000000 + t.tv_usec) - net_bw::start_time)) * 1000000.0 * 8.0;
    printf("Bandwidth = %f\n");
  }
  return dVar6;
}

Assistant:

double net_bw(char *iface, char *stage)
{
	static long old_s_bytes, new_s_bytes, old_r_bytes, new_r_bytes, start_time, end_time;
	long s_bytes, r_bytes;
	struct timeval t;
	double net_bw;
#ifdef HAVE_MAC_SYSCTL
	char *buf = NULL, *lim, *next;
	static int mib[6];
  	size_t mlen,vlen;
	struct if_msghdr *ifm;
	unsigned int ifindex;
  	mib[0] = CTL_NET;
  	mib[1] = PF_ROUTE;
	mib[2] = 0;
	mib[3] = 0;
	mib[4] = NET_RT_IFLIST;
	mib[5] = 0;
	
	mlen = 6;
	ifindex = if_nametoindex(iface);
	sysctl(mib,mlen,NULL,&vlen,NULL,0);
	buf = malloc(vlen);
	sysctl(mib,mlen,buf,&vlen,NULL,0);
	lim = buf+vlen;
	for(next = buf; next < lim; )
	{	
		ifm = (struct if_msghdr *)next;
		next += ifm->ifm_msglen;
	//	printf("Index %d, ifm index %d\n",ifindex,ifm->ifm_index);
	//	printf("ibytes %ld\n",ifm->ifm_data.ifi_ibytes);
		if(ifindex == ifm->ifm_index)
		{
	//		printf("Correct interface\n");
			r_bytes = (long) ifm->ifm_data.ifi_ibytes;
			s_bytes = (long) ifm->ifm_data.ifi_obytes;
			break;
		}
	}
//	printf("Received bytes %ld Sent bytes %ld\n",r_bytes,s_bytes);
	free(buf);
	
#else

	int i=0;
	char *temp_if;
	char *p;

	if(iface == NULL)
		temp_if = strdup("eth0");
	else
		temp_if = strdup((const char*)iface);
	sensor_slurp proc_net = { "/proc/net/dev" };
        p = update_file(&proc_net);
#ifndef HAVE_WINDOWS_H
	gettimeofday(&t, NULL);
#else
	/* GSE...  No gettimeofday on windows.
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */

	struct _timeb nowb;
	_ftime(&nowb);
	t.tv_sec = (long)nowb.time;
	t.tv_usec = nowb.millitm * 1000;
#endif
        while (p && strncmp(p,temp_if,strlen(temp_if)))
        {
                p = skip_token(p);
                p = skip_whitespace(p);
        }
	
        p = skip_token(p);
        p = skip_whitespace(p);
        r_bytes = strtol( p ,NULL,10);
	while(i <= 7) {
                p = skip_token(p);
                p = skip_whitespace(p);
                ++i;
        }
	s_bytes = strtol (p, NULL,10);
	free(temp_if);
#endif // end HAVE_MAC_SYSCTL
	if(strncmp(stage,"start",3)==0)
	{
		printf("Start %ld %ld \n",s_bytes,r_bytes);
		
		old_s_bytes = s_bytes;
		old_r_bytes = r_bytes;
		start_time = t.tv_sec * 1000000 + t.tv_usec;

		return 0.0;
	}
	printf("End %ld %ld \n",s_bytes,r_bytes);
	new_s_bytes = s_bytes;
	new_r_bytes = r_bytes;
	end_time = t.tv_sec * 1000000 + t.tv_usec;
	net_bw = (double) (((new_s_bytes - old_s_bytes) + (new_r_bytes - old_r_bytes)) / (double)(end_time - start_time))*1000000*8;
	printf("Bandwidth = %f\n",net_bw);
	return net_bw;			
	
}